

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

void __thiscall QTextEdit::QTextEdit(QTextEdit *this,QTextEditPrivate *dd,QWidget *parent)

{
  long in_FS_OFFSET;
  QArrayData *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractScrollArea::QAbstractScrollArea
            ((QAbstractScrollArea *)this,&dd->super_QAbstractScrollAreaPrivate,parent);
  *(undefined ***)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget =
       &PTR_metaObject_007fccf0;
  *(undefined ***)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.super_QPaintDevice =
       &PTR__QTextEdit_007fcef0;
  local_28 = (QArrayData *)0x0;
  uStack_20 = 0;
  local_18 = 0;
  QTextEditPrivate::init
            (*(QTextEditPrivate **)
              &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8,
             (EVP_PKEY_CTX *)&local_28);
  if (local_28 != (QArrayData *)0x0) {
    LOCK();
    (local_28->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_28,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTextEdit::QTextEdit(QTextEditPrivate &dd, QWidget *parent)
    : QAbstractScrollArea(dd, parent)
{
    Q_D(QTextEdit);
    d->init();
}